

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createGarbagePointSet
          (SceneGraph *this,int hash,size_t numPoints,bool mblur,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pvVar4;
  size_t sVar5;
  Vec3fx *pVVar6;
  undefined8 uVar7;
  Node *pNVar8;
  uint uVar9;
  int iVar10;
  PointSetNode *this_00;
  Vec3fx *pVVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  Ref<embree::SceneGraph::MaterialNode> local_40;
  Node *local_38;
  
  this_00 = (PointSetNode *)operator_new(0xb0);
  local_40 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_40.ptr != (MaterialNode *)0x0) {
    (*((local_40.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  PointSetNode::PointSetNode
            (this_00,RTC_GEOMETRY_TYPE_SPHERE_POINT,&local_40,(BBox1f)0x3f80000000000000,
             (ulong)mblur + 1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  local_38 = (Node *)this;
  if (local_40.ptr != (MaterialNode *)0x0) {
    (*((local_40.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  if (numPoints != 0) {
    uVar9 = (uint)(hash * -0x3361d2af) >> 0x11 | hash * 0x16a88000;
    uVar9 = (uVar9 * -0x194da000 | uVar9 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
    uVar9 = (uVar9 >> 0x10 ^ uVar9) * -0x7a143595;
    uVar9 = (uVar9 >> 0xd ^ uVar9) * -0x3d4d51cb;
    uVar9 = uVar9 >> 0x10 ^ uVar9;
    sVar18 = 0;
    do {
      pvVar4 = (this_00->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = pvVar4->size_active;
      uVar14 = pvVar4->size_alloced;
      uVar1 = sVar5 + 1;
      if (uVar14 < uVar1) {
        uVar17 = uVar1;
        uVar16 = uVar14;
        if (uVar14 != 0) {
          do {
            uVar17 = uVar16 * 2 + (ulong)(uVar16 * 2 == 0);
            uVar16 = uVar17;
          } while (uVar17 < uVar1);
        }
        if (uVar14 != uVar17) {
          pVVar6 = pvVar4->items;
          pVVar11 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
          pvVar4->items = pVVar11;
          if (pvVar4->size_active != 0) {
            lVar12 = 0;
            uVar14 = 0;
            do {
              puVar2 = (undefined8 *)((long)&pVVar6->field_0 + lVar12);
              uVar7 = puVar2[1];
              puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar12);
              *puVar3 = *puVar2;
              puVar3[1] = uVar7;
              uVar14 = uVar14 + 1;
              lVar12 = lVar12 + 0x10;
            } while (uVar14 < pvVar4->size_active);
          }
          alignedFree(pVVar6);
          pvVar4->size_active = sVar5;
          pvVar4->size_alloced = uVar17;
        }
      }
      iVar10 = uVar9 * 0x19660d;
      iVar13 = uVar9 * 0x17385ca9;
      iVar15 = uVar9 * -0x50b6f56b;
      uVar9 = uVar9 * 0x979e791 + 0xaaf95334;
      pVVar6 = pvVar4->items;
      pvVar4->size_active = uVar1;
      *(ulong *)&pVVar6[sVar5].field_0 = CONCAT44(iVar13 + 0x47502932,iVar10 + 0x3c6ef35f);
      *(ulong *)((long)&pVVar6[sVar5].field_0 + 8) = CONCAT44(uVar9,iVar15 + -0x2e330917);
      if (mblur) {
        pvVar4 = (this_00->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar5 = pvVar4[1].size_active;
        uVar14 = pvVar4[1].size_alloced;
        uVar1 = sVar5 + 1;
        if (uVar14 < uVar1) {
          uVar17 = uVar1;
          uVar16 = uVar14;
          if (uVar14 != 0) {
            do {
              uVar17 = uVar16 * 2 + (ulong)(uVar16 * 2 == 0);
              uVar16 = uVar17;
            } while (uVar17 < uVar1);
          }
          if (uVar14 != uVar17) {
            pVVar6 = pvVar4[1].items;
            pVVar11 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
            pvVar4[1].items = pVVar11;
            if (pvVar4[1].size_active != 0) {
              lVar12 = 0;
              uVar14 = 0;
              do {
                puVar2 = (undefined8 *)((long)&pVVar6->field_0 + lVar12);
                uVar7 = puVar2[1];
                puVar3 = (undefined8 *)((long)&(pvVar4[1].items)->field_0 + lVar12);
                *puVar3 = *puVar2;
                puVar3[1] = uVar7;
                uVar14 = uVar14 + 1;
                lVar12 = lVar12 + 0x10;
              } while (uVar14 < pvVar4[1].size_active);
            }
            alignedFree(pVVar6);
            pvVar4[1].size_active = sVar5;
            pvVar4[1].size_alloced = uVar17;
          }
        }
        iVar10 = uVar9 * 0x19660d;
        iVar13 = uVar9 * 0x17385ca9;
        iVar15 = uVar9 * -0x50b6f56b;
        uVar9 = uVar9 * 0x979e791 + 0xaaf95334;
        pVVar6 = pvVar4[1].items;
        pvVar4[1].size_active = uVar1;
        *(ulong *)&pVVar6[sVar5].field_0 = CONCAT44(iVar13 + 0x47502932,iVar10 + 0x3c6ef35f);
        *(ulong *)((long)&pVVar6[sVar5].field_0 + 8) = CONCAT44(uVar9,iVar15 + -0x2e330917);
      }
      sVar18 = sVar18 + 1;
    } while (sVar18 != numPoints);
  }
  pNVar8 = local_38;
  (local_38->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)pNVar8;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGarbagePointSet(int hash, size_t numPoints, bool mblur, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);

    Ref<SceneGraph::PointSetNode> mesh = new SceneGraph::PointSetNode(RTC_GEOMETRY_TYPE_SPHERE_POINT, material,BBox1f(0,1),mblur?2:1);

    for (size_t i = 0; i < numPoints; i++)
    {
      const float x = cast_i2f(RandomSampler_getUInt(sampler));
      const float y = cast_i2f(RandomSampler_getUInt(sampler));
      const float z = cast_i2f(RandomSampler_getUInt(sampler));
      const float r = cast_i2f(RandomSampler_getUInt(sampler));
      mesh->positions[0].push_back(Vec3ff(x, y, z, r));

      if (mblur)
      {
        const float x = cast_i2f(RandomSampler_getUInt(sampler));
        const float y = cast_i2f(RandomSampler_getUInt(sampler));
        const float z = cast_i2f(RandomSampler_getUInt(sampler));
        const float r = cast_i2f(RandomSampler_getUInt(sampler));
        mesh->positions[1].push_back(Vec3ff(x, y, z, r));
      }
    }

    return mesh.dynamicCast<SceneGraph::Node>();
  }